

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_reductions(options_i *options,vw *all)

{
  stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
  *this;
  base_learner *pbVar1;
  _func_learner<char,_char>_ptr_options_i_ptr_vw_ptr *local_28;
  
  this = &all->reduction_stack;
  local_28 = GD::setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = kernel_svm_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = ftrl_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = svrg_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = sender_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = gd_mf_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = print_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = noop_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = lda_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = bfgs_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = OjaNewton_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = baseline_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = ExpReplay::expreplay_setup<(char)98,simple_label>;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = active_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = active_cover_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = confidence_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = nn_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = mf_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = marginal_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = autolink_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = lrq_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = lrqfa_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = stagewise_poly_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = scorer_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = bs_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = binary_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = ExpReplay::expreplay_setup<(char)109,MULTICLASS::mc_label>;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = topk_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = oaa_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = boosting_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = ect_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = log_multi_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = recall_tree_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = memory_tree_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = classweight_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = multilabel_oaa_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cs_active_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = CSOAA::csoaa_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = interact_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = CSOAA::csldf_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cb_algs_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cb_adf_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = mwt_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cb_explore_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cb_explore_adf_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = VW::shared_feature_merger::shared_feature_merger_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = warm_cb_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cbify_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = cbifyldf_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = explore_eval_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = Search::setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  local_28 = audit_regressor_setup;
  std::
  deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
  ::emplace_back<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>
            ((deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>
              *)this,&local_28);
  pbVar1 = setup_base(options,all);
  all->l = pbVar1;
  return;
}

Assistant:

void parse_reductions(options_i& options, vw& all)
{
  // Base algorithms
  all.reduction_stack.push(GD::setup);
  all.reduction_stack.push(kernel_svm_setup);
  all.reduction_stack.push(ftrl_setup);
  all.reduction_stack.push(svrg_setup);
  all.reduction_stack.push(sender_setup);
  all.reduction_stack.push(gd_mf_setup);
  all.reduction_stack.push(print_setup);
  all.reduction_stack.push(noop_setup);
  all.reduction_stack.push(lda_setup);
  all.reduction_stack.push(bfgs_setup);
  all.reduction_stack.push(OjaNewton_setup);
  // all.reduction_stack.push(VW_CNTK::setup);

  // Score Users
  all.reduction_stack.push(baseline_setup);
  all.reduction_stack.push(ExpReplay::expreplay_setup<'b', simple_label>);
  all.reduction_stack.push(active_setup);
  all.reduction_stack.push(active_cover_setup);
  all.reduction_stack.push(confidence_setup);
  all.reduction_stack.push(nn_setup);
  all.reduction_stack.push(mf_setup);
  all.reduction_stack.push(marginal_setup);
  all.reduction_stack.push(autolink_setup);
  all.reduction_stack.push(lrq_setup);
  all.reduction_stack.push(lrqfa_setup);
  all.reduction_stack.push(stagewise_poly_setup);
  all.reduction_stack.push(scorer_setup);
  // Reductions
  all.reduction_stack.push(bs_setup);
  all.reduction_stack.push(binary_setup);

  all.reduction_stack.push(ExpReplay::expreplay_setup<'m', MULTICLASS::mc_label>);
  all.reduction_stack.push(topk_setup);
  all.reduction_stack.push(oaa_setup);
  all.reduction_stack.push(boosting_setup);
  all.reduction_stack.push(ect_setup);
  all.reduction_stack.push(log_multi_setup);
  all.reduction_stack.push(recall_tree_setup);
  all.reduction_stack.push(memory_tree_setup);
  all.reduction_stack.push(classweight_setup);
  all.reduction_stack.push(multilabel_oaa_setup);

  all.reduction_stack.push(cs_active_setup);
  all.reduction_stack.push(CSOAA::csoaa_setup);
  all.reduction_stack.push(interact_setup);
  all.reduction_stack.push(CSOAA::csldf_setup);
  all.reduction_stack.push(cb_algs_setup);
  all.reduction_stack.push(cb_adf_setup);
  all.reduction_stack.push(mwt_setup);
  all.reduction_stack.push(cb_explore_setup);
  all.reduction_stack.push(cb_explore_adf_setup);
  all.reduction_stack.push(VW::shared_feature_merger::shared_feature_merger_setup);
  // cbify/warm_cb can generate multi-examples. Merge shared features after them
  all.reduction_stack.push(warm_cb_setup);
  all.reduction_stack.push(cbify_setup);
  all.reduction_stack.push(cbifyldf_setup);
  all.reduction_stack.push(explore_eval_setup);
  all.reduction_stack.push(ExpReplay::expreplay_setup<'c', COST_SENSITIVE::cs_label>);
  all.reduction_stack.push(Search::setup);
  all.reduction_stack.push(audit_regressor_setup);

  all.l = setup_base(options, all);
}